

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::PrintTo<std::__cxx11::string_const,std::__cxx11::string>
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *value,ostream *os)

{
  char local_12;
  char local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_12,1);
  PrintStringTo(&value->first,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  PrintStringTo(&value->second,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_11,1);
  return;
}

Assistant:

void PrintTo(const ::std::pair<T1, T2>& value, ::std::ostream* os) {
  *os << '(';
  // We cannot use UniversalPrint(value.first, os) here, as T1 may be
  // a reference type.  The same for printing value.second.
  UniversalPrinter<T1>::Print(value.first, os);
  *os << ", ";
  UniversalPrinter<T2>::Print(value.second, os);
  *os << ')';
}